

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O3

int coda__pcre2_auto_possessify_8(PCRE2_UCHAR8 *code,compile_block_8 *cb)

{
  byte *pbVar1;
  int iVar2;
  BOOL BVar3;
  uint32_t *puVar4;
  ulong uVar5;
  PCRE2_UCHAR8 PVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar9;
  byte bVar10;
  uint utf;
  uint32_t *in_R8;
  int rec_limit;
  uint32_t list [8];
  int *in_stack_ffffffffffffff98;
  PCRE2_UCHAR8 local_5c [4];
  uint local_54;
  char cVar11;
  
  local_5c[0] = 0xe8;
  local_5c[1] = '\x03';
  local_5c[2] = '\0';
  local_5c[3] = '\0';
  uVar9 = CONCAT71((int7)((ulong)in_RDX >> 8),*code);
  if (*code < 0xab) {
    utf = cb->external_options >> 0x13 & 1;
    do {
      uVar7 = (int)uVar9 - 0x21;
      BVar3 = (BOOL)(compile_block_8 *)&stack0xffffffffffffffa8;
      if ((byte)uVar7 < 0x41) {
        bVar10 = (byte)uVar9;
        cVar11 = -0x34;
        if (((bVar10 < 0x55) && (cVar11 = -0x27, bVar10 < 0x48)) && (cVar11 = -0x1a, bVar10 < 0x3b))
        {
          cVar11 = -0xd;
          if (bVar10 < 0x2e) {
            cVar11 = '\0';
          }
        }
        bVar10 = cVar11 + bVar10;
        if (bVar10 < 0x29) {
          puVar4 = (uint32_t *)
                   get_chr_property_list(code,(BOOL)cb->fcc,BVar3,(uint8_t *)(ulong)uVar7,in_R8);
          uVar9 = extraout_RDX;
        }
        else {
          puVar4 = (uint32_t *)0x0;
        }
        if (bVar10 < 0x26) {
          local_54 = 1;
          uVar9 = 0;
          if ((0x2a00000000U >> ((ulong)bVar10 & 0x3f) & 1) == 0) goto LAB_0017f69a;
        }
        else {
LAB_0017f69a:
          local_54 = (uint)(bVar10 == 0x27);
        }
        if (((puVar4 != (uint32_t *)0x0) &&
            (BVar3 = compare_opcodes((PCRE2_SPTR8)puVar4,utf,(BOOL)cb,
                                     (compile_block_8 *)&stack0xffffffffffffffa8,puVar4,local_5c,
                                     in_stack_ffffffffffffff98), uVar9 = extraout_RDX_02,
            in_R8 = puVar4, BVar3 != 0)) && ((byte)(bVar10 - 0x21) < 8)) {
          *code = *code + (char)(0x506060707080809 >> ((bVar10 - 0x21 & 7) << 3));
        }
LAB_0017f6e1:
        uVar9 = CONCAT71((int7)(uVar9 >> 8),*code);
      }
      else {
        uVar7 = (int)uVar9 - 0x6e;
        if ((byte)uVar7 < 3) {
          bVar10 = code[0x21];
          if ((byte)(bVar10 + 0x9e) < 8) {
            puVar4 = (uint32_t *)
                     get_chr_property_list(code,(BOOL)cb->fcc,BVar3,(uint8_t *)(ulong)uVar7,in_R8);
            local_54 = ~(uint)bVar10 & 1;
            uVar9 = extraout_RDX_00;
            if ((puVar4 != (uint32_t *)0x0) &&
               (BVar3 = compare_opcodes((PCRE2_SPTR8)puVar4,utf,(BOOL)cb,
                                        (compile_block_8 *)&stack0xffffffffffffffa8,puVar4,local_5c,
                                        in_stack_ffffffffffffff98), uVar9 = extraout_RDX_01,
               in_R8 = puVar4, BVar3 != 0)) {
              code[0x21] = (PCRE2_UCHAR8)(0x6d6d6c6c6b6b6a6a >> ((bVar10 + 0x9e & 7) << 3));
            }
          }
          goto LAB_0017f6e1;
        }
      }
      uVar5 = uVar9 & 0xff;
      iVar2 = (int)uVar5;
      uVar8 = (ulong)(iVar2 - 0x55U);
      if (iVar2 - 0x55U < 0x23) {
        if ((0xe3fUL >> (uVar8 & 0x3f) & 1) == 0) {
          uVar9 = 0x11c0;
          if ((0x11c0UL >> (uVar8 & 0x3f) & 1) == 0) {
            if (uVar8 != 0x22) goto LAB_0017f734;
            uVar8 = (ulong)(ushort)(*(ushort *)(code + 5) << 8 | *(ushort *)(code + 5) >> 8);
            goto LAB_0017f74e;
          }
          PVar6 = code[3];
        }
        else {
          PVar6 = code[1];
        }
        uVar9 = (ulong)((byte)(PVar6 - 0xf) < 2);
        code = code + uVar9 * 2;
      }
      else {
LAB_0017f734:
        if ((iVar2 - 0x9aU < 9) && (uVar9 = 0x155, (0x155U >> (iVar2 - 0x9aU & 0x1f) & 1) != 0)) {
          uVar8 = (ulong)code[1];
LAB_0017f74e:
          code = code + uVar8;
        }
        else if (iVar2 == 0) {
          return 0;
        }
      }
      pbVar1 = code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                      [uVar5];
      uVar9 = CONCAT71((int7)(uVar9 >> 8),*pbVar1);
      code = code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                    [uVar5];
    } while (*pbVar1 < 0xab);
  }
  return -1;
}

Assistant:

int
PRIV(auto_possessify)(PCRE2_UCHAR *code, const compile_block *cb)
{
PCRE2_UCHAR c;
PCRE2_SPTR end;
PCRE2_UCHAR *repeat_opcode;
uint32_t list[8];
int rec_limit = 1000;  /* Was 10,000 but clang+ASAN uses a lot of stack. */
BOOL utf = (cb->external_options & PCRE2_UTF) != 0;
BOOL ucp = (cb->external_options & PCRE2_UCP) != 0;

for (;;)
  {
  c = *code;

  if (c >= OP_TABLE_LENGTH) return -1;   /* Something gone wrong */

  if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
    {
    c -= get_repeat_base(c) - OP_STAR;
    end = (c <= OP_MINUPTO) ?
      get_chr_property_list(code, utf, ucp, cb->fcc, list) : NULL;
    list[1] = c == OP_STAR || c == OP_PLUS || c == OP_QUERY || c == OP_UPTO;

    if (end != NULL && compare_opcodes(end, utf, ucp, cb, list, end,
        &rec_limit))
      {
      switch(c)
        {
        case OP_STAR:
        *code += OP_POSSTAR - OP_STAR;
        break;

        case OP_MINSTAR:
        *code += OP_POSSTAR - OP_MINSTAR;
        break;

        case OP_PLUS:
        *code += OP_POSPLUS - OP_PLUS;
        break;

        case OP_MINPLUS:
        *code += OP_POSPLUS - OP_MINPLUS;
        break;

        case OP_QUERY:
        *code += OP_POSQUERY - OP_QUERY;
        break;

        case OP_MINQUERY:
        *code += OP_POSQUERY - OP_MINQUERY;
        break;

        case OP_UPTO:
        *code += OP_POSUPTO - OP_UPTO;
        break;

        case OP_MINUPTO:
        *code += OP_POSUPTO - OP_MINUPTO;
        break;
        }
      }
    c = *code;
    }
  else if (c == OP_CLASS || c == OP_NCLASS || c == OP_XCLASS)
    {
#ifdef SUPPORT_WIDE_CHARS
    if (c == OP_XCLASS)
      repeat_opcode = code + GET(code, 1);
    else
#endif
      repeat_opcode = code + 1 + (32 / sizeof(PCRE2_UCHAR));

    c = *repeat_opcode;
    if (c >= OP_CRSTAR && c <= OP_CRMINRANGE)
      {
      /* The return from get_chr_property_list() will never be NULL when
      *code (aka c) is one of the three class opcodes. However, gcc with
      -fanalyzer notes that a NULL return is possible, and grumbles. Hence we
      put in a check. */

      end = get_chr_property_list(code, utf, ucp, cb->fcc, list);
      list[1] = (c & 1) == 0;

      if (end != NULL &&
          compare_opcodes(end, utf, ucp, cb, list, end, &rec_limit))
        {
        switch (c)
          {
          case OP_CRSTAR:
          case OP_CRMINSTAR:
          *repeat_opcode = OP_CRPOSSTAR;
          break;

          case OP_CRPLUS:
          case OP_CRMINPLUS:
          *repeat_opcode = OP_CRPOSPLUS;
          break;

          case OP_CRQUERY:
          case OP_CRMINQUERY:
          *repeat_opcode = OP_CRPOSQUERY;
          break;

          case OP_CRRANGE:
          case OP_CRMINRANGE:
          *repeat_opcode = OP_CRPOSRANGE;
          break;
          }
        }
      }
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    return 0;

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    if (code[1] == OP_PROP || code[1] == OP_NOTPROP) code += 2;
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSUPTO:
    if (code[1 + IMM2_SIZE] == OP_PROP || code[1 + IMM2_SIZE] == OP_NOTPROP)
      code += 2;
    break;

    case OP_CALLOUT_STR:
    code += GET(code, 1 + 2*LINK_SIZE);
    break;

#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    code += GET(code, 1);
    break;
#endif

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    code += code[1];
    break;
    }

  /* Add in the fixed length from the table */

  code += PRIV(OP_lengths)[c];

  /* In UTF-8 and UTF-16 modes, opcodes that are followed by a character may be
  followed by a multi-byte character. The length in the table is a minimum, so
  we have to arrange to skip the extra code units. */

#ifdef MAYBE_UTF_MULTI
  if (utf) switch(c)
    {
    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    if (HAS_EXTRALEN(code[-1])) code += GET_EXTRALEN(code[-1]);
    break;
    }
#else
  (void)(utf);  /* Keep compiler happy by referencing function argument */
#endif  /* SUPPORT_WIDE_CHARS */
  }
}